

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.cpp
# Opt level: O1

uint32_t __thiscall
GmmLib::GmmResourceInfoCommon::GetFastClearHeight(GmmResourceInfoCommon *this,uint32_t MipLevel)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  undefined4 extraout_var;
  GMM_TEXTURE_CALC *pGVar5;
  undefined4 extraout_var_00;
  undefined4 in_register_00000034;
  
  uVar1 = (*this->_vptr_GmmResourceInfoCommon[0x17])(this,CONCAT44(in_register_00000034,MipLevel));
  iVar2 = (*this->_vptr_GmmResourceInfoCommon[0x40])(this);
  iVar3 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
  pGVar5 = GmmGetTextureCalc((GMM_LIB_CONTEXT *)CONCAT44(extraout_var,iVar3));
  if (iVar2 == 1) {
    uVar4 = (*pGVar5->_vptr_GmmTextureCalc[0x1b])
                      (pGVar5,&this->Surf,(ulong)uVar1,pGVar5->_vptr_GmmTextureCalc[0x1b]);
    return uVar4;
  }
  iVar2 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
  if ((*(byte *)(CONCAT44(extraout_var_00,iVar2) + 0x20) & 4) == 0) {
    uVar4 = uVar1 + 1 >> 1;
  }
  else {
    uVar4 = uVar1 + 3 >> 2;
  }
  return uVar4;
}

Assistant:

uint32_t GmmLib::GmmResourceInfoCommon::GetFastClearHeight(uint32_t MipLevel)
{
    uint32_t height     = 0;
    uint32_t mipHeight  = GetMipHeight(MipLevel);
    uint32_t numSamples = GetNumSamples();

    GMM_TEXTURE_CALC *pTextureCalc;
    pTextureCalc = GMM_OVERRIDE_TEXTURE_CALC(&Surf, GetGmmLibContext());

    if(numSamples == 1)
    {
        height = pTextureCalc->ScaleFCRectHeight(&Surf, mipHeight);
    }
    else
    {
        if (GetGmmLibContext()->GetSkuTable().FtrXe2Compression)
        {
            height = GFX_ALIGN(mipHeight, 4) / 4;
        }
        else
        {
            height = GFX_ALIGN(mipHeight, 2) / 2;
        }
    }

    return height;
}